

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitter.c
# Opt level: O0

int advance_back(flatcc_emitter_t *E)

{
  flatcc_emitter_page_t *pfVar1;
  flatcc_emitter_page_t *p;
  flatcc_emitter_t *E_local;
  
  if ((E->back == (flatcc_emitter_page_t *)0x0) || (E->back->next == E->front)) {
    pfVar1 = (flatcc_emitter_page_t *)malloc(0xb98);
    if (pfVar1 == (flatcc_emitter_page_t *)0x0) {
      return -1;
    }
    E->capacity = E->capacity + 0xb80;
    if (E->back == (flatcc_emitter_page_t *)0x0) {
      E->front = pfVar1;
      E->back = pfVar1;
      pfVar1->next = pfVar1;
      pfVar1->prev = pfVar1;
      E->front_cursor = E->front->page + 0x5c0;
      E->back_cursor = E->front_cursor;
      E->front_left = 0x5c0;
      E->back_left = 0xb80 - E->front_left;
      pfVar1->page_offset = -(int)E->front_left;
      return 0;
    }
    pfVar1->prev = E->back;
    pfVar1->next = E->front;
    E->front->prev = pfVar1;
    E->back->next = pfVar1;
    E->back = pfVar1;
  }
  else {
    E->back = E->back->next;
  }
  E->back_cursor = E->back->page;
  E->back_left = 0xb80;
  E->back->page_offset = E->back->prev->page_offset + 0xb80;
  return 0;
}

Assistant:

static int advance_back(flatcc_emitter_t *E)
{
    flatcc_emitter_page_t *p = 0;

    if (E->back && E->back->next != E->front) {
        E->back = E->back->next;
        goto done;
    }
    if (!(p = FLATCC_EMITTER_ALLOC(sizeof(flatcc_emitter_page_t)))) {
        return -1;
    }
    E->capacity += FLATCC_EMITTER_PAGE_SIZE;
    if (E->back) {
        p->prev = E->back;
        p->next = E->front;
        E->front->prev = p;
        E->back->next = p;
        E->back = p;
        goto done;
    }
    /*
     * The first page is shared between front and back to avoid
     * double unecessary extra allocation.
     */
    E->front = p;
    E->back = p;
    p->next = p;
    p->prev = p;
    E->front_cursor = E->front->page + FLATCC_EMITTER_PAGE_SIZE / 2;
    E->back_cursor = E->front_cursor;
    E->front_left = FLATCC_EMITTER_PAGE_SIZE / 2;
    E->back_left = FLATCC_EMITTER_PAGE_SIZE - E->front_left;
    p->page_offset = -(flatbuffers_soffset_t)E->front_left;
    return 0;
done:
    E->back_cursor = E->back->page;
    E->back_left = FLATCC_EMITTER_PAGE_SIZE;
    E->back->page_offset = E->back->prev->page_offset + FLATCC_EMITTER_PAGE_SIZE;
    return 0;
}